

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::VectorDCE::RewriteInsertInstruction
          (VectorDCE *this,Instruction *current_inst,BitVector *live_components,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *dead_dbg_value)

{
  IRContext *pIVar1;
  pointer puVar2;
  pointer pOVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t before;
  const_iterator __end2;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  BitVector temp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  bVar7 = current_inst->has_result_id_;
  uVar4 = (bVar7 & 1) + 1;
  if (current_inst->has_type_id_ == false) {
    uVar4 = (uint)bVar7;
  }
  if ((int)((ulong)((long)(current_inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(current_inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar4 == 2
     ) {
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    uVar5 = 0;
    if ((bVar7 & 1U) != 0) {
      uVar5 = Instruction::GetSingleWordOperand(current_inst,(uint)current_inst->has_type_id_);
    }
    IRContext::KillNamesAndDecorates(pIVar1,uVar5);
    uVar5 = (current_inst->has_result_id_ & 1) + 1;
    if (current_inst->has_type_id_ == false) {
      uVar5 = (uint)current_inst->has_result_id_;
    }
  }
  else {
    uVar5 = Instruction::GetSingleWordOperand(current_inst,uVar4 + 2);
    uVar6 = (ulong)(uVar5 >> 6);
    puVar2 = (live_components->bits_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((uVar6 < (ulong)((long)(live_components->bits_).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) &&
       (uVar8 = 1L << ((byte)uVar5 & 0x3f), (puVar2[uVar6] >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_70,&live_components->bits_);
      puVar2 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((uVar6 < (ulong)((long)local_70.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_70.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3)) &&
         ((local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6] & uVar8) != 0)) {
        local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] =
             local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6] & ~uVar8;
      }
      do {
        if (puVar2 == local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,current_inst);
          uVar5 = 0;
          if (current_inst->has_type_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(current_inst,0);
          }
          local_58._16_4_ = MemPass::Type2Undef(&this->super_MemPass,uVar5);
          local_58._24_8_ = local_58 + 0x10;
          local_58._0_8_ = &PTR__SmallVector_00b02ef8;
          local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._8_8_ = 1;
          uVar6 = (ulong)(current_inst->has_result_id_ & 1) + 1;
          if (current_inst->has_type_id_ == false) {
            uVar6 = (ulong)current_inst->has_result_id_;
          }
          uVar6 = uVar6 + 1;
          pOVar3 = (current_inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = ((long)(current_inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                  -0x5555555555555555;
          if (uVar8 < uVar6 || uVar8 - uVar6 == 0) {
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)
                     ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                     (ulong)(uint)((int)uVar6 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_58);
          local_58._0_8_ = &PTR__SmallVector_00b02ef8;
          if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_38,local_38._M_head_impl);
          }
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,current_inst);
          bVar7 = true;
LAB_0051a8be:
          if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            return bVar7;
          }
          operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          return bVar7;
        }
        if (*puVar2 != 0) {
          bVar7 = false;
          goto LAB_0051a8be;
        }
        puVar2 = puVar2 + 1;
      } while( true );
    }
    MarkDebugValueUsesAsDead(this,current_inst,dead_dbg_value);
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    uVar5 = 0;
    if (current_inst->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(current_inst,(uint)current_inst->has_type_id_);
    }
    IRContext::KillNamesAndDecorates(pIVar1,uVar5);
    uVar4 = (current_inst->has_result_id_ & 1) + 1;
    if (current_inst->has_type_id_ == false) {
      uVar4 = (uint)current_inst->has_result_id_;
    }
    uVar5 = uVar4 + 1;
  }
  before = 0;
  uVar5 = Instruction::GetSingleWordOperand(current_inst,uVar5);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if (current_inst->has_result_id_ == true) {
    before = Instruction::GetSingleWordOperand(current_inst,(uint)current_inst->has_type_id_);
  }
  IRContext::ReplaceAllUsesWith(pIVar1,before,uVar5);
  return true;
}

Assistant:

bool VectorDCE::RewriteInsertInstruction(
    Instruction* current_inst, const utils::BitVector& live_components,
    std::vector<Instruction*>* dead_dbg_value) {
  // If the value being inserted is not live, then we can skip the insert.

  if (current_inst->NumInOperands() == 2) {
    // If there are no indices, then this is the same as a copy.
    context()->KillNamesAndDecorates(current_inst->result_id());
    uint32_t object_id =
        current_inst->GetSingleWordInOperand(kInsertObjectIdInIdx);
    context()->ReplaceAllUsesWith(current_inst->result_id(), object_id);
    return true;
  }

  uint32_t insert_index = current_inst->GetSingleWordInOperand(2);
  if (!live_components.Get(insert_index)) {
    MarkDebugValueUsesAsDead(current_inst, dead_dbg_value);
    context()->KillNamesAndDecorates(current_inst->result_id());
    uint32_t composite_id =
        current_inst->GetSingleWordInOperand(kInsertCompositeIdInIdx);
    context()->ReplaceAllUsesWith(current_inst->result_id(), composite_id);
    return true;
  }

  // If the values already in the composite are not used, then replace it with
  // an undef.
  utils::BitVector temp = live_components;
  temp.Clear(insert_index);
  if (temp.Empty()) {
    context()->ForgetUses(current_inst);
    uint32_t undef_id = Type2Undef(current_inst->type_id());
    current_inst->SetInOperand(kInsertCompositeIdInIdx, {undef_id});
    context()->AnalyzeUses(current_inst);
    return true;
  }

  return false;
}